

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O2

void X86_ATT_printInst(MCInst *MI,SStream *OS,void *info)

{
  uint8_t *puVar1;
  char cVar2;
  cs_struct *h;
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar3;
  _Bool _Var4;
  uint uVar5;
  x86_reg xVar6;
  MCOperand *pMVar7;
  int64_t iVar8;
  MCRegisterClass *c;
  char *s;
  cs_detail *pcVar9;
  byte bVar10;
  SStream *O;
  MCRegisterInfo *extraout_RDX;
  MCRegisterInfo *extraout_RDX_00;
  MCRegisterInfo *extraout_RDX_01;
  MCRegisterInfo *extraout_RDX_02;
  MCRegisterInfo *extraout_RDX_03;
  MCRegisterInfo *extraout_RDX_04;
  MCRegisterInfo *extraout_RDX_05;
  MCRegisterInfo *extraout_RDX_06;
  MCRegisterInfo *extraout_RDX_07;
  MCRegisterInfo *extraout_RDX_08;
  MCRegisterInfo *extraout_RDX_09;
  MCRegisterInfo *extraout_RDX_10;
  MCRegisterInfo *extraout_RDX_11;
  MCRegisterInfo *extraout_RDX_12;
  MCRegisterInfo *extraout_RDX_13;
  MCRegisterInfo *MRI;
  MCRegisterInfo *extraout_RDX_14;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  cs_ac_type access1;
  x86_reg reg;
  uint8_t access [6];
  cs_ac_type access2;
  x86_reg reg2;
  
  if (MI->assembly[0] != '\0') {
    strncpy(OS->buffer,MI->assembly,0x200);
    return;
  }
  if ((MI->csh->mode == CS_MODE_64) && (uVar5 = MCInst_getOpcode(MI), uVar5 == 0x169)) {
    SStream_concat0(OS,"callq\t");
    MCInst_setOpcodePub(MI,0x38);
    printPCRelImm(MI,(uint)OS,O);
    return;
  }
  uVar5 = MCInst_getOpcode(MI);
  if (uVar5 == 0x2291) {
    uVar5 = MCInst_getNumOperands(MI);
    MRI = extraout_RDX_09;
    if (uVar5 == 0) {
      pcVar13 = "xstorerng";
LAB_001c1448:
      s = cs_strdup(pcVar13);
      for (pcVar13 = s; cVar2 = *pcVar13, cVar2 != '\0'; pcVar13 = pcVar13 + 1) {
        if ((cVar2 == ' ') || (cVar2 == '\t')) {
          *pcVar13 = '\0';
          pcVar13 = pcVar13 + 1;
          break;
        }
      }
      SStream_concat0(OS,s);
      MRI = extraout_RDX_10;
      if (*pcVar13 != '\0') {
        SStream_concat0(OS,anon_var_dwarf_2e687b + 0x11);
        MRI = extraout_RDX_11;
        do {
          cVar2 = *pcVar13;
          if (cVar2 == '$') {
            if (pcVar13[1] == -1) {
              pcVar14 = pcVar13 + 3;
              if (pcVar13[3] == '\x01') {
                printf64mem(MI,(int)pcVar13[2] - 1,OS);
                MRI = extraout_RDX_14;
              }
            }
            else {
              pcVar14 = pcVar13 + 1;
              printOperand(MI,(int)pcVar13[1] - 1,OS);
              MRI = extraout_RDX_13;
            }
          }
          else {
            if (cVar2 == '\0') break;
            SStream_concat(OS,"%c",(ulong)(uint)(int)cVar2);
            MRI = extraout_RDX_12;
            pcVar14 = pcVar13;
          }
          pcVar13 = pcVar14 + 1;
        } while( true );
      }
      if (s != (char *)0x0) {
        (*cs_mem_free)(s);
        goto LAB_001c151d;
      }
    }
  }
  else if (uVar5 == 0x18) {
    uVar5 = MCInst_getNumOperands(MI);
    MRI = extraout_RDX_03;
    if (uVar5 == 1) {
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      MRI = extraout_RDX_04;
      if (_Var4) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar8 = MCOperand_getImm(pMVar7);
        MRI = extraout_RDX_05;
        if (iVar8 == 10) {
          pcVar13 = "aam";
          goto LAB_001c1448;
        }
      }
    }
  }
  else if (uVar5 == 0x272) {
    uVar5 = MCInst_getNumOperands(MI);
    MRI = extraout_RDX_06;
    if (uVar5 == 6) {
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isReg(pMVar7);
      MRI = extraout_RDX_07;
      if (_Var4) {
        c = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x2a);
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        _Var4 = MCRegisterClass_contains(c,uVar5);
        MRI = extraout_RDX_08;
        if (_Var4) {
          pcVar13 = anon_var_dwarf_25c913;
          goto LAB_001c1448;
        }
      }
    }
  }
  else {
    MRI = extraout_RDX;
    if ((uVar5 == 0x17) && (uVar5 = MCInst_getNumOperands(MI), MRI = extraout_RDX_00, uVar5 == 1)) {
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      MRI = extraout_RDX_01;
      if (_Var4) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar8 = MCOperand_getImm(pMVar7);
        MRI = extraout_RDX_02;
        if (iVar8 == 10) {
          pcVar13 = "aad";
          goto LAB_001c1448;
        }
      }
    }
  }
  printInstruction(MI,OS,MRI);
LAB_001c151d:
  if (MI->flat_insn->id == 0x2b9) {
    SStream_Init(OS);
    SStream_concat0(OS,"sysexit");
  }
  if (MI->has_imm == true) {
    pcVar9 = MI->flat_insn->detail;
    bVar10 = (pcVar9->field_6).x86.op_count;
    if (bVar10 < 2) {
      *(uint8_t *)((long)&pcVar9->field_6 + 0x68) = MI->imm_size;
    }
    else if ((MI->flat_insn->id & 0xfffffffe) != 0x9a) {
      lVar11 = 0xc0;
      for (uVar12 = 0; uVar12 < bVar10; uVar12 = uVar12 + 1) {
        if (*(int *)((long)pcVar9->regs_read + lVar11 + -0x20) == 2) {
          *(uint8_t *)((long)pcVar9->regs_read + lVar11) =
               pcVar9->groups[(ulong)(bVar10 - 1) * 0x30 + 0x75];
          pcVar9 = MI->flat_insn->detail;
          bVar10 = (pcVar9->field_6).x86.op_count;
        }
        lVar11 = lVar11 + 0x30;
      }
    }
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    access[4] = '\0';
    access[5] = '\0';
    access[0] = '\0';
    access[1] = '\0';
    access[2] = '\0';
    access[3] = '\0';
    uVar5 = MCInst_getOpcode(MI);
    if (((((uVar5 - 0x916 < 0x36) &&
          ((0x24924900249249U >> ((ulong)(uVar5 - 0x916) & 0x3f) & 1) != 0)) ||
         ((uVar5 - 0x98f < 0x2e && ((0x249249249249U >> ((ulong)(uVar5 - 0x98f) & 0x3f) & 1) != 0)))
         ) || ((uVar5 - 0x9d7 < 0x2f &&
               ((0x492492249249U >> ((ulong)(uVar5 - 0x9d7) & 0x3f) & 1) != 0)))) ||
       ((uVar5 - 0xa74 < 0x3e && ((0x2492490000249249U >> ((ulong)(uVar5 - 0xa74) & 0x3f) & 1) != 0)
        ))) {
      pcVar9 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar9->field_6 + 0x78),(void *)((long)&pcVar9->field_6 + 0x48),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_IMM;
      paVar3 = &MI->flat_insn->detail->field_6;
      ((cs_m68k_op *)paVar3)[1].mem.out_disp = 1;
      ((cs_m68k_op *)paVar3)[1].mem.disp = 0;
      ((cs_m68k_op *)paVar3)[1].mem.scale = '\0';
      ((cs_m68k_op *)paVar3)[1].mem.bitfield = '\0';
      *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x68) = 1;
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
    uVar5 = MCInst_getOpcode(MI);
    xVar6 = X86_insn_reg_att(uVar5,&access1);
    reg = xVar6;
    if (xVar6 == X86_REG_INVALID) {
      uVar5 = MCInst_getOpcode(MI);
      _Var4 = X86_insn_reg_att2(uVar5,&reg,&access1,&reg2,&access2);
      if (_Var4) {
        (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = reg;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x68) = MI->csh->regsize_map[reg];
        *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x69) = (undefined1)access1;
        (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = reg2;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x98) = MI->csh->regsize_map[reg2];
        *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x69) = (undefined1)access2;
        (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
      }
    }
    else {
      pcVar9 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar9->field_6 + 0x78),(void *)((long)&pcVar9->field_6 + 0x48),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar6;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x68) = MI->csh->regsize_map[xVar6];
      *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x69) = (undefined1)access1;
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
    h = MI->csh;
    uVar5 = MCInst_getOpcode(MI);
    get_op_access(h,uVar5,access,&(MI->flat_insn->detail->field_6).x86.field_15.eflags);
    *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x69) = access[0];
    *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x99) = access[1];
  }
  return;
}

Assistant:

void X86_ATT_printInst(MCInst *MI, SStream *OS, void *info)
{
	char *mnem;
	x86_reg reg, reg2;
	enum cs_ac_type access1, access2;
	int i;

	// perhaps this instruction does not need printer
	if (MI->assembly[0]) {
		strncpy(OS->buffer, MI->assembly, sizeof(OS->buffer));
		return;
	}

	// Output CALLpcrel32 as "callq" in 64-bit mode.
	// In Intel annotation it's always emitted as "call".
	//
	// TODO: Probably this hack should be redesigned via InstAlias in
	// InstrInfo.td as soon as Requires clause is supported properly
	// for InstAlias.
	if (MI->csh->mode == CS_MODE_64 && MCInst_getOpcode(MI) == X86_CALLpcrel32) {
		SStream_concat0(OS, "callq\t");
		MCInst_setOpcodePub(MI, X86_INS_CALL);
		printPCRelImm(MI, 0, OS);
		return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, OS, info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, OS, info);

	// HACK TODO: fix this in machine description
	switch(MI->flat_insn->id) {
		default: break;
		case X86_INS_SYSEXIT:
				 SStream_Init(OS);
				 SStream_concat0(OS, "sysexit");
				 break;
	}

	if (MI->has_imm) {
		// if op_count > 1, then this operand's size is taken from the destination op
		if (MI->flat_insn->detail->x86.op_count > 1) {
			if (MI->flat_insn->id != X86_INS_LCALL && MI->flat_insn->id != X86_INS_LJMP) {
				for (i = 0; i < MI->flat_insn->detail->x86.op_count; i++) {
					if (MI->flat_insn->detail->x86.operands[i].type == X86_OP_IMM)
						MI->flat_insn->detail->x86.operands[i].size =
							MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count - 1].size;
				}
			}
		} else
			MI->flat_insn->detail->x86.operands[0].size = MI->imm_size;
	}

	if (MI->csh->detail) {
		uint8_t access[6] = {0};

		// some instructions need to supply immediate 1 in the first op
		switch(MCInst_getOpcode(MI)) {
			default:
				break;
			case X86_SHL8r1:
			case X86_SHL16r1:
			case X86_SHL32r1:
			case X86_SHL64r1:
			case X86_SAL8r1:
			case X86_SAL16r1:
			case X86_SAL32r1:
			case X86_SAL64r1:
			case X86_SHR8r1:
			case X86_SHR16r1:
			case X86_SHR32r1:
			case X86_SHR64r1:
			case X86_SAR8r1:
			case X86_SAR16r1:
			case X86_SAR32r1:
			case X86_SAR64r1:
			case X86_RCL8r1:
			case X86_RCL16r1:
			case X86_RCL32r1:
			case X86_RCL64r1:
			case X86_RCR8r1:
			case X86_RCR16r1:
			case X86_RCR32r1:
			case X86_RCR64r1:
			case X86_ROL8r1:
			case X86_ROL16r1:
			case X86_ROL32r1:
			case X86_ROL64r1:
			case X86_ROR8r1:
			case X86_ROR16r1:
			case X86_ROR32r1:
			case X86_ROR64r1:
			case X86_SHL8m1:
			case X86_SHL16m1:
			case X86_SHL32m1:
			case X86_SHL64m1:
			case X86_SAL8m1:
			case X86_SAL16m1:
			case X86_SAL32m1:
			case X86_SAL64m1:
			case X86_SHR8m1:
			case X86_SHR16m1:
			case X86_SHR32m1:
			case X86_SHR64m1:
			case X86_SAR8m1:
			case X86_SAR16m1:
			case X86_SAR32m1:
			case X86_SAR64m1:
			case X86_RCL8m1:
			case X86_RCL16m1:
			case X86_RCL32m1:
			case X86_RCL64m1:
			case X86_RCR8m1:
			case X86_RCR16m1:
			case X86_RCR32m1:
			case X86_RCR64m1:
			case X86_ROL8m1:
			case X86_ROL16m1:
			case X86_ROL32m1:
			case X86_ROL64m1:
			case X86_ROR8m1:
			case X86_ROR16m1:
			case X86_ROR32m1:
			case X86_ROR64m1:
				// shift all the ops right to leave 1st slot for this new register op
				memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
						sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_IMM;
				MI->flat_insn->detail->x86.operands[0].imm = 1;
				MI->flat_insn->detail->x86.operands[0].size = 1;
				MI->flat_insn->detail->x86.op_count++;
		}

		// special instruction needs to supply register op
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand

		//printf(">>> opcode = %u\n", MCInst_getOpcode(MI));

		reg = X86_insn_reg_att(MCInst_getOpcode(MI), &access1);
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.operands[0].access = access1;

			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_att2(MCInst_getOpcode(MI), &reg, &access1, &reg2, &access2)) {

				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[0].access = access1;
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.operands[0].access = access2;
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}

#ifndef CAPSTONE_DIET
		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[0].access = access[0];
		MI->flat_insn->detail->x86.operands[1].access = access[1];
#endif
	}
}